

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

Amount __thiscall cfd::TransactionContext::GetFeeAmount(TransactionContext *this)

{
  AbstractTxIn *pAVar1;
  AbstractTxOut *pAVar2;
  bool bVar3;
  uint32_t vout;
  int64_t iVar4;
  CfdException *this_00;
  undefined8 extraout_RDX;
  AbstractTxIn *this_01;
  TxOut *txout_ref;
  AbstractTxOut *this_02;
  Amount AVar5;
  allocator local_589;
  undefined1 local_588 [32];
  Amount local_568;
  Amount input;
  Amount output;
  UtxoData utxo;
  
  core::Amount::Amount(&input);
  UtxoData::UtxoData(&utxo);
  this_01 = &((this->super_Transaction).vin_.
              super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->super_AbstractTxIn;
  pAVar1 = &((this->super_Transaction).vin_.
             super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
             super__Vector_impl_data._M_finish)->super_AbstractTxIn;
  while( true ) {
    if (this_01 == pAVar1) {
      core::Amount::Amount(&output);
      pAVar2 = &((this->super_Transaction).vout_.
                 super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                 super__Vector_impl_data._M_finish)->super_AbstractTxOut;
      for (this_02 = &((this->super_Transaction).vout_.
                       super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                       _M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOut;
          this_02 != pAVar2; this_02 = this_02 + 1) {
        AVar5 = core::AbstractTxOut::GetValue(this_02);
        local_588._0_8_ = AVar5.amount_;
        local_588[8] = AVar5.ignore_check_;
        core::Amount::operator+=(&output,(Amount *)local_588);
      }
      AVar5 = core::operator-(&input,&output);
      local_588._0_8_ = AVar5.amount_;
      local_588[8] = AVar5.ignore_check_;
      iVar4 = core::Amount::GetSatoshiValue((Amount *)local_588);
      if (iVar4 < 0) {
        core::Amount::Amount(&local_568);
      }
      else {
        local_568._9_7_ = local_588._9_7_;
        local_568.ignore_check_ = local_588[8];
        local_568.amount_ = local_588._0_8_;
      }
      UtxoData::~UtxoData(&utxo);
      AVar5._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
      AVar5.ignore_check_ = local_568.ignore_check_;
      AVar5.amount_ = local_568.amount_;
      return AVar5;
    }
    core::AbstractTxIn::GetTxid((Txid *)local_588,this_01);
    vout = core::AbstractTxIn::GetVout(this_01);
    core::OutPoint::OutPoint((OutPoint *)&output,(Txid *)local_588,vout);
    core::Txid::~Txid((Txid *)local_588);
    bVar3 = IsFindUtxoMap(this,(OutPoint *)&output,&utxo);
    if (!bVar3) break;
    core::Amount::operator+=(&input,&utxo.amount);
    core::Txid::~Txid((Txid *)&output);
    this_01 = this_01 + 1;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_588,"Utxo is not found. GetFeeAmount fail.",&local_589);
  core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_588);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

Amount TransactionContext::GetFeeAmount() const {
  Amount input;
  UtxoData utxo;
  for (const auto& txin_ref : vin_) {
    OutPoint outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
    if (!IsFindUtxoMap(outpoint, &utxo)) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Utxo is not found. GetFeeAmount fail.");
    }
    input += utxo.amount;
  }

  Amount output;
  for (const auto& txout_ref : vout_) {
    output += txout_ref.GetValue();
  }
  Amount result = input - output;
  if (result.GetSatoshiValue() < 0) {
    return Amount();
  }
  return result;
}